

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

void sexp_push_utf8_char(sexp ctx,int i,sexp port)

{
  byte bVar1;
  sexp psVar2;
  uint len;
  long lVar3;
  uchar ch [6];
  byte abStack_20 [8];
  
  len = sexp_utf8_char_byte_count(i);
  sexp_utf8_encode_char(abStack_20 + 2,len,i);
  if ((port->value).type.getters == (sexp)0x0) {
    if (0 < (int)len) {
      lVar3 = (ulong)len + 1;
      do {
        bVar1 = abStack_20[lVar3];
        psVar2 = (port->value).type.print;
        (port->value).type.print = (sexp)((long)&psVar2[-1].value + 0x60bf);
        *(byte *)(((port->value).bytecode.max_depth - 1) + (long)psVar2) = bVar1;
        lVar3 = lVar3 + -1;
      } while (1 < lVar3);
    }
  }
  else if (0 < (int)len) {
    lVar3 = (ulong)len + 1;
    do {
      ungetc((uint)abStack_20[lVar3],(FILE *)(port->value).type.getters);
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

void sexp_push_utf8_char (sexp ctx, int i, sexp port) {
  unsigned char ch[6];
  int len = sexp_utf8_char_byte_count(i);
  sexp_utf8_encode_char(ch, len, i);
  if (sexp_port_stream(port))  {
    while (len>0)
      ungetc(ch[--len], sexp_port_stream(port));
  } else {
    while (len>0)
      sexp_port_buf(port)[--sexp_port_offset(port)] = ch[--len];
  }
}